

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeMemExpandBlob(Mem *pMem)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  if ((pMem->flags & 0x4000) != 0) {
    iVar3 = (pMem->u).nZero + pMem->n;
    if (iVar3 < 2) {
      iVar3 = 1;
    }
    iVar2 = sqlite3VdbeMemGrow(pMem,iVar3,1);
    iVar3 = 7;
    if (iVar2 == 0) {
      iVar3 = 0;
      memset(pMem->z + pMem->n,0,(long)(pMem->u).nZero);
      pMem->n = pMem->n + (pMem->u).nZero;
      pbVar1 = (byte *)((long)&pMem->flags + 1);
      *pbVar1 = *pbVar1 & 0xbd;
    }
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemExpandBlob(Mem *pMem){
  if( pMem->flags & MEM_Zero ){
    int nByte;
    assert( pMem->flags&MEM_Blob );
    assert( (pMem->flags&MEM_RowSet)==0 );
    assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );

    /* Set nByte to the number of bytes required to store the expanded blob. */
    nByte = pMem->n + pMem->u.nZero;
    if( nByte<=0 ){
      nByte = 1;
    }
    if( sqlite3VdbeMemGrow(pMem, nByte, 1) ){
      return SQLITE_NOMEM;
    }

    memset(&pMem->z[pMem->n], 0, pMem->u.nZero);
    pMem->n += pMem->u.nZero;
    pMem->flags &= ~(MEM_Zero|MEM_Term);
  }
  return SQLITE_OK;
}